

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_worker-inl.h
# Opt level: O0

void __thiscall spdlog::details::periodic_worker::~periodic_worker(periodic_worker *this)

{
  bool bVar1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lock;
  periodic_worker *this_local;
  
  lock._M_device = (mutex_type *)this;
  bVar1 = std::thread::joinable((thread *)(this + 8));
  if (bVar1) {
    std::lock_guard<std::mutex>::lock_guard(&local_18,(mutex_type *)(this + 0x10));
    *this = (periodic_worker)0x0;
    std::lock_guard<std::mutex>::~lock_guard(&local_18);
    std::condition_variable::notify_one();
    std::thread::join();
  }
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x38));
  std::thread::~thread((thread *)(this + 8));
  return;
}

Assistant:

SPDLOG_INLINE periodic_worker::~periodic_worker()
{
    if (worker_thread_.joinable())
    {
        {
            std::lock_guard<std::mutex> lock(mutex_);
            active_ = false;
        }
        cv_.notify_one();
        worker_thread_.join();
    }
}